

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.hpp
# Opt level: O1

void __thiscall Movegen::pawn_caps(Movegen *this,U64 *left,U64 *right,U64 *ep_left,U64 *ep_right)

{
  ulong uVar1;
  code *pcVar2;
  code *pcVar3;
  
  if (this->pawns != 0) {
    uVar1 = (ulong)this->us;
    *left = this->pawns & (&bitboards::pawnmaskleft)[uVar1];
    *right = (&bitboards::pawnmaskright)[uVar1] & this->pawns;
    pcVar3 = anon_unknown.dwarf_96d6f::shift<(Dir)7>;
    if (uVar1 == 0) {
      pcVar3 = anon_unknown.dwarf_96d6f::shift<(Dir)4>;
    }
    pcVar2 = anon_unknown.dwarf_96d6f::shift<(Dir)6>;
    if (uVar1 == 0) {
      pcVar2 = anon_unknown.dwarf_96d6f::shift<(Dir)5>;
    }
    if (*left != 0) {
      (*pcVar2)(left);
      *left = *left & this->ctarget;
    }
    if (*right != 0) {
      (*pcVar3)(right);
      *right = *right & this->ctarget;
    }
    if (this->eps != no_square) {
      uVar1 = (ulong)this->us;
      *ep_left = (&bitboards::pawnmaskleft)[uVar1] & this->pawns & (&DAT_00141b88)[uVar1 == 0];
      *ep_right = (&bitboards::pawnmaskright)[uVar1] & this->pawns & (&DAT_00141b88)[uVar1 == 0];
      if (*ep_left != 0) {
        (*pcVar2)(ep_left);
        *ep_left = *ep_left & (&bitboards::squares)[this->eps];
      }
      if (*ep_right != 0) {
        (*pcVar3)(ep_right);
        *ep_right = *ep_right & (&bitboards::squares)[this->eps];
      }
    }
  }
  return;
}

Assistant:

inline void Movegen::pawn_caps(U64& left, U64& right, U64& ep_left, U64& ep_right) {

	if (pawns == 0ULL) return;

	// normal captures - non promotions
	left = pawns & bitboards::pawnmaskleft[us];
	right = pawns & bitboards::pawnmaskright[us];

	auto sw = (us == white ? shift<NW> : shift<SE>);
	auto se = (us == white ? shift<NE> : shift<SW>);

	if (left != 0ULL) {
		se(left);
		left &= ctarget;
	}

	if (right != 0ULL) {
		sw(right);
		right &= ctarget;
	}

	// ep captures - evasions are checked individually
	if (eps == Square::no_square) return;
	auto r = (us == white ? Row::r5 : Row::r4);
	ep_left = pawns & bitboards::pawnmaskleft[us] & bitboards::row[r];
	ep_right = pawns & bitboards::pawnmaskright[us] & bitboards::row[r];

	if (ep_left != 0ULL) {
		se(ep_left);
		ep_left &= bitboards::squares[eps];
	}

	if (ep_right != 0ULL) {
		sw(ep_right);
		ep_right &= bitboards::squares[eps];
	}
}